

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ConstraintBlockSymbol::serializeTo
          (ConstraintBlockSymbol *this,ASTSerializer *serializer)

{
  byte bVar1;
  Constraint *__n;
  string str;
  
  __n = getConstraints(this);
  ASTSerializer::write(serializer,0xb,"constraints",(size_t)__n);
  bVar1 = (this->flags).m_bits;
  if (bVar1 != 0) {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    if ((bVar1 & 2) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"pure,");
    }
    if ((bVar1 & 4) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"static,");
    }
    if ((bVar1 & 8) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"extern,");
    }
    if ((bVar1 & 0x10) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"explicitExtern,");
    }
    if ((bVar1 & 0x20) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"initial,");
    }
    if ((bVar1 & 0x40) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"extends,");
    }
    if ((char)bVar1 < '\0') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"final,");
    }
    if (str._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&str);
    }
    ASTSerializer::write(serializer,5,"flags",(size_t)&str);
    std::__cxx11::string::~string((string *)&str);
  }
  return;
}

Assistant:

void ConstraintBlockSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("constraints", getConstraints());
    if (flags)
        serializer.write("flags", flagsToStr(flags));
}